

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::DescriptorScriptPubKeyMan::GetDescriptorString
          (DescriptorScriptPubKeyMan *this,string *out,bool priv)

{
  element_type *peVar1;
  undefined1 uVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock78;
  FlatSigningProvider provider;
  unique_lock<std::recursive_mutex> local_160;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_150;
  FlatSigningProvider local_120;
  long local_28;
  int iVar3;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_160,&this->cs_desc_man,
             "cs_desc_man",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0xaab,false);
  local_120.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_120.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_0114ae68;
  local_120.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_120.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  local_120.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_120.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  local_120.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_120.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_120.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_120.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_120.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  GetKeys((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_> *)
          &local_150,this);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::operator=(&local_120.keys._M_t,&local_150);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_150);
  peVar1 = (this->m_wallet_descriptor).descriptor.
           super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (priv) {
    iVar3 = (*peVar1->_vptr_Descriptor[6])(peVar1,&local_120,out);
    uVar2 = (undefined1)iVar3;
  }
  else {
    iVar3 = (*peVar1->_vptr_Descriptor[7])(peVar1,&local_120,out,&(this->m_wallet_descriptor).cache)
    ;
    uVar2 = (undefined1)iVar3;
  }
  FlatSigningProvider::~FlatSigningProvider(&local_120);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_160);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::GetDescriptorString(std::string& out, const bool priv) const
{
    LOCK(cs_desc_man);

    FlatSigningProvider provider;
    provider.keys = GetKeys();

    if (priv) {
        // For the private version, always return the master key to avoid
        // exposing child private keys. The risk implications of exposing child
        // private keys together with the parent xpub may be non-obvious for users.
        return m_wallet_descriptor.descriptor->ToPrivateString(provider, out);
    }

    return m_wallet_descriptor.descriptor->ToNormalizedString(provider, out, &m_wallet_descriptor.cache);
}